

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orderedCollection.c
# Opt level: O0

sysbvm_tuple_t sysbvm_orderedCollection_at(sysbvm_tuple_t orderedCollection,size_t index)

{
  _Bool _Var1;
  sysbvm_size_t sVar2;
  size_t size;
  sysbvm_orderedCollection_t *orderedCollectionObject;
  size_t index_local;
  sysbvm_tuple_t orderedCollection_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(orderedCollection);
  if (_Var1) {
    sVar2 = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(orderedCollection + 0x10));
    if (index < sVar2) {
      orderedCollection_local =
           *(sysbvm_tuple_t *)(*(long *)(orderedCollection + 0x18) + 0x10 + index * 8);
    }
    else {
      sysbvm_error_indexOutOfBounds();
      orderedCollection_local = 0;
    }
  }
  else {
    orderedCollection_local = 0;
  }
  return orderedCollection_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_orderedCollection_at(sysbvm_tuple_t orderedCollection, size_t index)
{
    if(!sysbvm_tuple_isNonNullPointer(orderedCollection)) return SYSBVM_NULL_TUPLE;

    sysbvm_orderedCollection_t *orderedCollectionObject = (sysbvm_orderedCollection_t*)orderedCollection;
    size_t size = sysbvm_tuple_size_decode(orderedCollectionObject->size);
    if(index >= size)
    {
        sysbvm_error_indexOutOfBounds();
        return SYSBVM_NULL_TUPLE;
    }

    return ((sysbvm_array_t*)orderedCollectionObject->storage)->elements[index];
}